

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>
helics::make_filter(FilterTypes type,Core *core,string_view name)

{
  pointer pFVar1;
  undefined8 in_RCX;
  int in_ESI;
  tuple<helics::Filter_*,_std::default_delete<helics::Filter>_> in_RDI;
  undefined8 in_R8;
  __single_object *dfilt;
  Core *in_stack_000000d0;
  FilterTypes in_stack_000000dc;
  Filter *in_stack_000000e0;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff70;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *__u;
  _Head_base<0UL,_helics::Filter_*,_false> this;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Core **in_stack_ffffffffffffffa8;
  undefined8 local_50;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> local_38;
  undefined1 local_29;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in_ESI == 5) {
    local_29 = 0;
    __u = &local_38;
    this._M_head_impl =
         (Filter *)
         in_RDI.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    local_18 = in_RCX;
    uStack_10 = in_R8;
    std::
    make_unique<helics::CloningFilter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
              (in_stack_ffffffffffffffa8,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>::
    unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>,void>
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)this._M_head_impl
               ,__u);
    std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::~unique_ptr
              (in_stack_ffffffffffffff70);
    std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::get
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff70);
    addOperations(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
    pFVar1 = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::operator->
                       ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)0x2cbb01
                       );
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this._M_head_impl,(char *)__u);
    (*(pFVar1->super_Interface)._vptr_Interface[6])
              (pFVar1,in_stack_ffffffffffffffa8,local_50,local_18,uStack_10);
  }
  else {
    std::
    make_unique<helics::Filter,helics::Core*&,std::basic_string_view<char,std::char_traits<char>>&>
              (in_stack_ffffffffffffffa8,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::get
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff70);
    addOperations(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
  }
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, Core* core, std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        std::unique_ptr<Filter> dfilt = std::make_unique<CloningFilter>(core, name);
        addOperations(dfilt.get(), type, core);
        dfilt->setString("delivery", name);
        return dfilt;
    }
    auto dfilt = std::make_unique<Filter>(core, name);
    addOperations(dfilt.get(), type, core);
    return dfilt;
}